

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chainparamsbase.cpp
# Opt level: O0

void SelectBaseParams(ChainType chain)

{
  long lVar1;
  long in_FS_OFFSET;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff98;
  unique_ptr<CBaseChainParams,_std::default_delete<CBaseChainParams>_> *in_stack_ffffffffffffffa0;
  unique_ptr<CBaseChainParams,_std::default_delete<CBaseChainParams>_> *this;
  string *network;
  ArgsManager *in_stack_ffffffffffffffb8;
  unique_ptr<CBaseChainParams,_std::default_delete<CBaseChainParams>_> local_30 [3];
  ChainType in_stack_ffffffffffffffec;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this = local_30;
  CreateBaseChainParams((ChainType)((ulong)this >> 0x20));
  std::unique_ptr<CBaseChainParams,_std::default_delete<CBaseChainParams>_>::operator=
            (this,in_stack_ffffffffffffffa0);
  std::unique_ptr<CBaseChainParams,_std::default_delete<CBaseChainParams>_>::~unique_ptr(this);
  network = (string *)(local_30 + 1);
  ChainTypeToString_abi_cxx11_(in_stack_ffffffffffffffec);
  ArgsManager::SelectConfigNetwork(in_stack_ffffffffffffffb8,network);
  std::__cxx11::string::~string(in_stack_ffffffffffffff98);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void SelectBaseParams(const ChainType chain)
{
    globalChainBaseParams = CreateBaseChainParams(chain);
    gArgs.SelectConfigNetwork(ChainTypeToString(chain));
}